

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btIDebugDraw.h
# Opt level: O2

void __thiscall
btIDebugDraw::drawCylinder
          (btIDebugDraw *this,btScalar radius,btScalar halfHeight,int upAxis,btTransform *transform,
          btVector3 *color)

{
  float fVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int i;
  uint uVar5;
  long lVar6;
  float fVar7;
  btVector3 bVar8;
  float local_c8;
  float fStack_c4;
  btVector3 local_b8;
  btVector3 local_a8;
  btVector3 local_98;
  btVector3 local_88;
  btVector3 local_78;
  long local_68;
  btScalar local_60 [4];
  btScalar local_50 [4];
  undefined1 local_40 [16];
  
  uVar2 = *(undefined8 *)(transform->m_origin).m_floats;
  fVar1 = (transform->m_origin).m_floats[2];
  lVar6 = (long)upAxis;
  local_78.m_floats[0] = 0.0;
  local_78.m_floats[1] = 0.0;
  local_78.m_floats[2] = 0.0;
  local_78.m_floats[3] = 0.0;
  local_78.m_floats[lVar6] = halfHeight;
  local_88.m_floats[0] = 0.0;
  local_88.m_floats[1] = 0.0;
  local_88.m_floats[2] = 0.0;
  local_88.m_floats[3] = 0.0;
  local_88.m_floats[lVar6] = -halfHeight;
  local_98.m_floats[0] = 0.0;
  local_98.m_floats[1] = 0.0;
  local_98.m_floats[2] = 0.0;
  local_98.m_floats[3] = 0.0;
  local_98.m_floats[lVar6] = halfHeight;
  iVar3 = (upAxis + 1) % 3;
  iVar4 = (upAxis + 2) % 3;
  local_68 = lVar6;
  for (uVar5 = 0; local_c8 = (float)uVar2, fStack_c4 = (float)((ulong)uVar2 >> 0x20), uVar5 < 0x168;
      uVar5 = uVar5 + 0x1e) {
    fVar7 = sinf((float)(int)uVar5 * 0.017453292);
    local_88.m_floats[iVar3] = fVar7 * radius;
    local_98.m_floats[iVar3] = fVar7 * radius;
    fVar7 = cosf((float)(int)uVar5 * 0.017453292);
    local_88.m_floats[iVar4] = fVar7 * radius;
    local_98.m_floats[iVar4] = fVar7 * radius;
    bVar8 = operator*(&transform->m_basis,&local_88);
    local_a8.m_floats[1] = bVar8.m_floats[1] + fStack_c4;
    local_a8.m_floats[0] = bVar8.m_floats[0] + local_c8;
    local_a8.m_floats[2] = bVar8.m_floats[2] + fVar1;
    local_a8.m_floats[3] = 0.0;
    bVar8 = operator*(&transform->m_basis,&local_98);
    local_b8.m_floats[1] = bVar8.m_floats[1] + fStack_c4;
    local_b8.m_floats[0] = bVar8.m_floats[0] + local_c8;
    local_b8.m_floats[2] = bVar8.m_floats[2] + fVar1;
    local_b8.m_floats[3] = 0.0;
    (*this->_vptr_btIDebugDraw[4])(this,&local_a8,&local_b8,color);
  }
  local_a8.m_floats = (btScalar  [4])ZEXT816(0);
  local_a8.m_floats[local_68] = 1.0;
  local_b8.m_floats = (btScalar  [4])ZEXT816(0);
  local_b8.m_floats[iVar3] = 1.0;
  bVar8 = operator*(&transform->m_basis,&local_78);
  local_40._4_4_ = fStack_c4 - bVar8.m_floats[1];
  local_40._0_4_ = local_c8 - bVar8.m_floats[0];
  local_40._8_4_ = fVar1 - bVar8.m_floats[2];
  local_40._12_4_ = 0;
  local_50 = (btScalar  [4])operator*(&transform->m_basis,&local_a8);
  local_60 = (btScalar  [4])operator*(&transform->m_basis,&local_b8);
  (*this->_vptr_btIDebugDraw[0x11])
            (radius,(ulong)(uint)radius,0,0x40c90fdb,0x41200000,this,local_40,local_50,local_60,
             color,0);
  bVar8 = operator*(&transform->m_basis,&local_78);
  local_40._4_4_ = bVar8.m_floats[1] + fStack_c4;
  local_40._0_4_ = bVar8.m_floats[0] + local_c8;
  local_40._8_4_ = bVar8.m_floats[2] + fVar1;
  local_40._12_4_ = 0;
  local_50 = (btScalar  [4])operator*(&transform->m_basis,&local_a8);
  local_60 = (btScalar  [4])operator*(&transform->m_basis,&local_b8);
  (*this->_vptr_btIDebugDraw[0x11])
            (radius,(ulong)(uint)radius,0,0x40c90fdb,0x41200000,this,local_40,local_50,local_60,
             color,0);
  return;
}

Assistant:

virtual void drawCylinder(btScalar radius, btScalar halfHeight, int upAxis, const btTransform& transform, const btVector3& color)
	{
		btVector3 start = transform.getOrigin();
		btVector3	offsetHeight(0,0,0);
		offsetHeight[upAxis] = halfHeight;
		int stepDegrees=30;
		btVector3 capStart(0.f,0.f,0.f);
		capStart[upAxis] = -halfHeight;
		btVector3 capEnd(0.f,0.f,0.f);
		capEnd[upAxis] = halfHeight;

		for (int i=0;i<360;i+=stepDegrees)
		{
			capEnd[(upAxis+1)%3] = capStart[(upAxis+1)%3] = btSin(btScalar(i)*SIMD_RADS_PER_DEG)*radius;
			capEnd[(upAxis+2)%3] = capStart[(upAxis+2)%3]  = btCos(btScalar(i)*SIMD_RADS_PER_DEG)*radius;
			drawLine(start+transform.getBasis() * capStart,start+transform.getBasis() * capEnd, color);
		}
		// Drawing top and bottom caps of the cylinder
		btVector3 yaxis(0,0,0);
		yaxis[upAxis] = btScalar(1.0);
		btVector3 xaxis(0,0,0);
		xaxis[(upAxis+1)%3] = btScalar(1.0);
		drawArc(start-transform.getBasis()*(offsetHeight),transform.getBasis()*yaxis,transform.getBasis()*xaxis,radius,radius,0,SIMD_2_PI,color,false,btScalar(10.0));
		drawArc(start+transform.getBasis()*(offsetHeight),transform.getBasis()*yaxis,transform.getBasis()*xaxis,radius,radius,0,SIMD_2_PI,color,false,btScalar(10.0));
	}